

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhash.cc
# Opt level: O1

int __thiscall bdHashSpace::printHashSpace(bdHashSpace *this,ostream *out)

{
  char cVar1;
  _Rb_tree_node_base *p_Var2;
  _Self __tmp;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"bdHashSpace::printHashSpace()",0x1d);
  cVar1 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"--------------------------------------------",0x2c);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  for (p_Var2 = (this->mHashTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->mHashTable)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    bdHashSet::printHashSet((bdHashSet *)&p_Var2[1]._M_right,out);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"--------------------------------------------",0x2c);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return 1;
}

Assistant:

int     bdHashSpace::printHashSpace(std::ostream &out) {
	std::map<bdNodeId, bdHashSet>::iterator it;
	out << "bdHashSpace::printHashSpace()" << std::endl;
	out << "--------------------------------------------" << std::endl;
	
	for (it = mHashTable.begin(); it != mHashTable.end(); it++) {
		it->second.printHashSet(out);
	}
	out << "--------------------------------------------" << std::endl;
	return 1;
}